

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall
pbrt::RealisticCamera::ComputeThickLensApproximation(RealisticCamera *this,Float *pz,Float *fz)

{
  float fVar1;
  Float FVar2;
  Ray local_78;
  Ray local_50;
  
  fVar1 = *(float *)(((this->super_CameraBase).film.
                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff) +
                    0x20) * 0.001;
  FVar2 = LensFrontZ(this);
  local_50.o.super_Tuple3<pbrt::Point3,_float>.z = FVar2 + 1.0;
  local_78.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_50.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_50.d.super_Tuple3<pbrt::Vector3,_float>.z = -1.0;
  local_50.time = 0.0;
  local_50.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_78.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_78.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_78.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_78._20_8_ = SUB168(ZEXT816(0),4);
  local_78.d.super_Tuple3<pbrt::Vector3,_float>.x = local_78.o.super_Tuple3<pbrt::Point3,_float>.x;
  local_78.d.super_Tuple3<pbrt::Vector3,_float>.y = local_78.o.super_Tuple3<pbrt::Point3,_float>.y;
  local_50.o.super_Tuple3<pbrt::Point3,_float>.x = fVar1;
  FVar2 = TraceLensesFromScene(this,&local_50,&local_78);
  if ((FVar2 == 0.0) && (!NAN(FVar2))) {
    ErrorExit<>(
               "Unable to trace ray from scene to film for thick lens approximation. Is aperture stop extremely small?"
               );
  }
  ComputeCardinalPoints(&local_50,&local_78,pz,fz);
  local_78.o.super_Tuple3<pbrt::Point3,_float>.z =
       (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].thickness + -1.0;
  local_78.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_78.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_78.d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_78.d.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  local_78.time = 0.0;
  local_78.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_78.o.super_Tuple3<pbrt::Point3,_float>.x = fVar1;
  FVar2 = TraceLensesFromFilm(this,&local_78,&local_50);
  if ((FVar2 == 0.0) && (!NAN(FVar2))) {
    ErrorExit<>(
               "Unable to trace ray from film to scene for thick lens approximation. Is aperture stop extremely small?"
               );
  }
  ComputeCardinalPoints(&local_78,&local_50,pz + 1,fz + 1);
  return;
}

Assistant:

void RealisticCamera::ComputeThickLensApproximation(Float pz[2], Float fz[2]) const {
    // Find height $x$ from optical axis for parallel rays
    Float x = .001f * film.Diagonal();

    // Compute cardinal points for film side of lens system
    Ray rScene(Point3f(x, 0, LensFrontZ() + 1), Vector3f(0, 0, -1));
    Ray rFilm;
    if (!TraceLensesFromScene(rScene, &rFilm))
        ErrorExit("Unable to trace ray from scene to film for thick lens "
                  "approximation. Is aperture stop extremely small?");
    ComputeCardinalPoints(rScene, rFilm, &pz[0], &fz[0]);

    // Compute cardinal points for scene side of lens system
    rFilm = Ray(Point3f(x, 0, LensRearZ() - 1), Vector3f(0, 0, 1));
    if (TraceLensesFromFilm(rFilm, &rScene) == 0)
        ErrorExit("Unable to trace ray from film to scene for thick lens "
                  "approximation. Is aperture stop extremely small?");
    ComputeCardinalPoints(rFilm, rScene, &pz[1], &fz[1]);
}